

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O0

TempArenaAllocatorObject * __thiscall
ThreadContext::GetTemporaryAllocator(ThreadContext *this,LPCWSTR name)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  RecyclableData *pRVar5;
  TempArenaAllocatorWrapper<false> **ppTVar6;
  nullptr_t local_30;
  ThreadContext *local_28;
  TempArenaAllocatorObject *allocator;
  LPCWSTR name_local;
  ThreadContext *this_local;
  
  allocator = (TempArenaAllocatorObject *)name;
  name_local = (LPCWSTR)this;
  BVar3 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0x903,"(ExceptionCheck::CanHandleOutOfMemory())",
                       "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (this->temporaryArenaAllocatorCount == 0) {
    this_local = (ThreadContext *)Js::TempArenaAllocatorWrapper<false>::Create(this);
  }
  else {
    this->temporaryArenaAllocatorCount = this->temporaryArenaAllocatorCount - 1;
    pRVar5 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->
                       (&this->recyclableData);
    ppTVar6 = Memory::WriteBarrierPtr::operator_cast_to_TempArenaAllocatorWrapper__
                        ((WriteBarrierPtr *)
                         (pRVar5->temporaryArenaAllocators + this->temporaryArenaAllocatorCount));
    local_28 = (ThreadContext *)*ppTVar6;
    local_30 = (nullptr_t)0x0;
    pRVar5 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->
                       (&this->recyclableData);
    Memory::WriteBarrierPtr<Js::TempArenaAllocatorWrapper<false>_>::operator=
              (pRVar5->temporaryArenaAllocators + this->temporaryArenaAllocatorCount,&local_30);
    this_local = local_28;
  }
  return (TempArenaAllocatorObject *)this_local;
}

Assistant:

Js::TempArenaAllocatorObject *
ThreadContext::GetTemporaryAllocator(LPCWSTR name)
{
    AssertCanHandleOutOfMemory();

    if (temporaryArenaAllocatorCount != 0)
    {
        temporaryArenaAllocatorCount--;
        Js::TempArenaAllocatorObject * allocator = recyclableData->temporaryArenaAllocators[temporaryArenaAllocatorCount];
        recyclableData->temporaryArenaAllocators[temporaryArenaAllocatorCount] = nullptr;
        return allocator;
    }

    return Js::TempArenaAllocatorObject::Create(this);
}